

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O2

uint32_t instr_get_size(thanm_instr_t *instr,int32_t version)

{
  uint32_t uVar1;
  list_node_t *plVar2;
  
  uVar1 = (uint)(version != 0) * 4 + 4;
  plVar2 = (list_node_t *)&instr->params;
  while (plVar2 = plVar2->next, plVar2 != (list_node_t *)0x0) {
    uVar1 = uVar1 + (uint)(*plVar2->data != 0x73) * 2 + 2;
  }
  return uVar1;
}

Assistant:

uint32_t
instr_get_size(
    thanm_instr_t* instr,
    int32_t version
) {
    uint32_t size = version == 0 ? sizeof(anm_instr0_t) : sizeof(anm_instr_t);
    thanm_param_t* param;
    list_for_each(&instr->params, param) {
        switch(param->type) {
            case 's':
                size += sizeof(int16_t);
                break;
            default:
                size += 4;
        }
    }

    return size;
}